

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall
sf::Image::copy(Image *this,Image *source,uint destX,uint destY,IntRect *sourceRect,bool applyAlpha)

{
  byte bVar1;
  int iVar2;
  Image *pIVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int i_1;
  Uint8 alpha;
  Uint8 *dst;
  Uint8 *src;
  int j;
  int i;
  Uint8 *dstPixels;
  Uint8 *srcPixels;
  int dstStride;
  int srcStride;
  int rows;
  int pitch;
  int height;
  int width;
  IntRect srcRect;
  uint local_80;
  int local_68;
  uint local_64;
  reference local_60;
  const_reference local_58;
  uint local_3c;
  uint local_38;
  undefined8 local_34;
  Vector2u local_2c;
  
  pIVar3 = source;
  if (((((source->m_size).x == 0) || ((source->m_size).y == 0)) ||
      (pIVar3 = this, (this->m_size).x == 0)) || ((this->m_size).y == 0)) {
    local_80 = (uint)pIVar3;
  }
  else {
    local_34._0_4_ = sourceRect->left;
    local_34._4_4_ = sourceRect->top;
    local_2c.x = sourceRect->width;
    local_2c.y = sourceRect->height;
    if ((local_2c.x == 0) || (local_2c.y == 0)) {
      local_34 = 0;
      local_2c = source->m_size;
    }
    else {
      if ((int)local_34 < 0) {
        local_34 = local_34 & 0xffffffff00000000;
      }
      if ((long)local_34 < 0) {
        local_34 = local_34 & 0xffffffff;
      }
      if ((int)(source->m_size).x < (int)local_2c.x) {
        local_2c.x = (source->m_size).x;
      }
      if ((int)(source->m_size).y < (int)local_2c.y) {
        local_2c.y = (source->m_size).y;
      }
    }
    local_38 = local_2c.x;
    local_3c = local_2c.y;
    if ((this->m_size).x < destX + local_2c.x) {
      local_38 = (this->m_size).x - destX;
    }
    local_80 = destY + local_2c.y;
    if ((this->m_size).y < local_80) {
      local_80 = (this->m_size).y - destY;
      local_3c = local_80;
    }
    if ((0 < (int)local_38) && (0 < (int)local_3c)) {
      iVar6 = (source->m_size).x << 2;
      iVar2 = (this->m_size).x << 2;
      local_58 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&source->m_pixels,0);
      local_58 = local_58 + ((int)local_34 + local_34._4_4_ * (source->m_size).x) * 4;
      local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_pixels,0);
      local_60 = local_60 + (destX + destY * (this->m_size).x) * 4;
      if (applyAlpha) {
        for (local_64 = 0; local_80 = local_64, (int)local_64 < (int)local_3c;
            local_64 = local_64 + 1) {
          for (local_68 = 0; local_68 < (int)local_38; local_68 = local_68 + 1) {
            pbVar4 = local_58 + (local_68 << 2);
            pbVar5 = local_60 + (local_68 << 2);
            bVar1 = pbVar4[3];
            *pbVar5 = (byte)((long)(int)((uint)*pbVar4 * (uint)bVar1 +
                                        (uint)*pbVar5 * (0xff - (uint)bVar1)) / 0xff);
            pbVar5[1] = (byte)((long)(int)((uint)pbVar4[1] * (uint)bVar1 +
                                          (uint)pbVar5[1] * (0xff - (uint)bVar1)) / 0xff);
            pbVar5[2] = (byte)((long)(int)((uint)pbVar4[2] * (uint)bVar1 +
                                          (uint)pbVar5[2] * (0xff - (uint)bVar1)) / 0xff);
            pbVar5[3] = bVar1 + (char)((int)((uint)pbVar5[3] * (0xff - (uint)bVar1)) / 0xff);
          }
          local_58 = local_58 + iVar6;
          local_60 = local_60 + iVar2;
        }
      }
      else {
        for (local_80 = 0; (int)local_80 < (int)local_3c; local_80 = local_80 + 1) {
          memcpy(local_60,local_58,(long)(int)(local_38 << 2));
          local_58 = local_58 + iVar6;
          local_60 = local_60 + iVar2;
        }
      }
    }
  }
  return local_80;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = source.m_size.x;
        srcRect.height = source.m_size.y;
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = source.m_size.x;
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = source.m_size.y;
    }

    // Then find the valid bounds of the destination rectangle
    int width  = srcRect.width;
    int height = srcRect.height;
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    int          pitch     = width * 4;
    int          rows      = height;
    int          srcStride = source.m_size.x * 4;
    int          dstStride = m_size.x * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (srcRect.left + srcRect.top * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (int i = 0; i < rows; ++i)
        {
            for (int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha value of the source pixel
                Uint8 alpha = src[3];
                dst[0] = (src[0] * alpha + dst[0] * (255 - alpha)) / 255;
                dst[1] = (src[1] * alpha + dst[1] * (255 - alpha)) / 255;
                dst[2] = (src[2] * alpha + dst[2] * (255 - alpha)) / 255;
                dst[3] = alpha + dst[3] * (255 - alpha) / 255;
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}